

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O3

void ReadFillInMissingBoxes(ON_Brep *brep)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ON_BrepLoop *pOVar4;
  bool bVar5;
  int iVar6;
  ON_Curve *this;
  ON_BrepTrim *this_00;
  long lVar7;
  ulong uVar8;
  ON_BoundingBox local_60;
  
  iVar1 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  uVar2 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  if (0 < (long)iVar1) {
    lVar7 = 0;
    do {
      this_00 = (ON_BrepTrim *)
                ((long)&(((ON_CurveProxy *)
                         (&(((brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                             super_ON_ClassArray<ON_BrepTrim>.m_a)->super_ON_CurveProxy).
                           m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                        super_ON_Object._vptr_ON_Object + lVar7);
      bVar5 = ON_BoundingBox::IsValid(&this_00->m_pbox);
      if (!bVar5) {
        this = ON_BrepTrim::TrimCurveOf(this_00);
        if (this != (ON_Curve *)0x0) {
          ON_Geometry::BoundingBox(&local_60,&this->super_ON_Geometry);
          (this_00->m_pbox).m_max.y = local_60.m_max.y;
          (this_00->m_pbox).m_max.z = local_60.m_max.z;
          (this_00->m_pbox).m_min.z = local_60.m_min.z;
          (this_00->m_pbox).m_max.x = local_60.m_max.x;
          (this_00->m_pbox).m_min.x = local_60.m_min.x;
          (this_00->m_pbox).m_min.y = local_60.m_min.y;
        }
      }
      lVar7 = lVar7 + 0xe8;
    } while ((long)iVar1 * 0xe8 - lVar7 != 0);
  }
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      pOVar4 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
      bVar5 = ON_BoundingBox::IsValid(&pOVar4[uVar8].m_pbox);
      if (!bVar5) {
        iVar6 = pOVar4[uVar8].m_ti.m_count;
        if (0 < iVar6) {
          lVar7 = 0;
          do {
            uVar3 = pOVar4[uVar8].m_ti.m_a[lVar7];
            if ((int)uVar3 < iVar1 && -1 < (int)uVar3) {
              ON_BoundingBox::Union
                        (&pOVar4[uVar8].m_pbox,
                         &(brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_a[uVar3].m_pbox);
              iVar6 = pOVar4[uVar8].m_ti.m_count;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < iVar6);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
  }
  return;
}

Assistant:

static
void ReadFillInMissingBoxes( ON_Brep& brep )
{
  // older files did not save bounding box information
  int ti, li, lti, trim_count, loop_count;
  const ON_Curve* c2;
  trim_count = brep.m_T.Count();
  loop_count = brep.m_L.Count();
  for ( ti = 0; ti < trim_count; ti++ )
  {
    ON_BrepTrim& trim = brep.m_T[ti];
    if ( !trim.m_pbox.IsValid() ) 
    {
      c2 = trim.TrimCurveOf();
      if ( c2 )
        trim.m_pbox = c2->BoundingBox();
    }
  }

  for ( li = 0; li < loop_count; li++ )
  {
    ON_BrepLoop& loop = brep.m_L[li];
    if ( !loop.m_pbox.IsValid() ) 
    {
      for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
      {
        ti = loop.m_ti[lti];
        if ( ti >= 0 && ti < trim_count )
          loop.m_pbox.Union( brep.m_T[ti].m_pbox );
      }
    }
  }
}